

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O1

void __thiscall QCommandLineParser::process(QCommandLineParser *this,QStringList *arguments)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  bool bVar5;
  QCommandLineParserPrivate *this_00;
  long in_FS_OFFSET;
  QString local_c8;
  QString local_a8;
  QString local_90;
  QString local_78;
  char *local_60;
  undefined8 local_58;
  Data *local_50;
  char16_t *pcStack_48;
  qsizetype local_40;
  undefined2 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->d;
  bVar4 = QCommandLineParserPrivate::parse(this_00,arguments);
  if (!bVar4) {
    QCoreApplication::applicationName();
    qVar3 = local_a8.d.size;
    pcVar2 = local_a8.d.ptr;
    pDVar1 = local_a8.d.d;
    local_a8.d.size = 0;
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = (char16_t *)0x0;
    errorText(&local_c8,this);
    local_40 = local_c8.d.size;
    pcStack_48 = local_c8.d.ptr;
    local_50 = local_c8.d.d;
    local_c8.d.size = 0;
    local_78.d.d = pDVar1;
    local_78.d.ptr = pcVar2;
    local_78.d.size = qVar3;
    local_60 = ": ";
    local_58 = 2;
    local_c8.d.d = (Data *)0x0;
    local_c8.d.ptr = (char16_t *)0x0;
    local_38 = 10;
    QStringBuilder::operator_cast_to_QString(&local_90,(QStringBuilder *)&local_78);
    showMessageAndExit(Error,&local_90,1);
  }
  bVar4 = this->d->builtinVersionOption;
  if (bVar4 == true) {
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = L"version";
    local_78.d.size = 7;
    this_00 = (QCommandLineParserPrivate *)this;
    bVar5 = isSet(this,&local_78);
  }
  else {
    bVar5 = false;
  }
  if ((bVar4 != false) &&
     ((QCommandLineParserPrivate *)local_78.d.d != (QCommandLineParserPrivate *)0x0)) {
    LOCK();
    *(int *)&(((QString *)&(local_78.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_78.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_78.d.d)->super_QArrayData)->d).d == 0) {
      this_00 = (QCommandLineParserPrivate *)local_78.d.d;
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar5 != false) {
    showVersion((QCommandLineParser *)this_00);
  }
  bVar4 = this->d->builtinHelpOption;
  if (bVar4 == true) {
    local_90.d.d = (Data *)0x0;
    local_90.d.ptr = L"help";
    local_90.d.size = 4;
    bVar5 = isSet(this,&local_90);
  }
  else {
    bVar5 = false;
  }
  if ((bVar4 != false) && (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar5 != false) {
    QCommandLineParserPrivate::showHelp(this->d,0,false);
  }
  bVar4 = this->d->builtinHelpOption;
  if (bVar4 == true) {
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = L"help-all";
    local_a8.d.size = 8;
    bVar5 = isSet(this,&local_a8);
  }
  else {
    bVar5 = false;
  }
  if ((bVar4 != false) && (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar5 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
    __stack_chk_fail();
  }
  QCommandLineParserPrivate::showHelp(this->d,0,true);
}

Assistant:

void QCommandLineParser::process(const QStringList &arguments)
{
    if (!d->parse(arguments)) {
        showMessageAndExit(MessageType::Error,
                           QCoreApplication::applicationName() + ": "_L1 + errorText() + u'\n',
                           EXIT_FAILURE);
    }

    if (d->builtinVersionOption && isSet(QStringLiteral("version")))
        showVersion();

    if (d->builtinHelpOption && isSet(QStringLiteral("help")))
        d->showHelp(EXIT_SUCCESS, false);

    if (d->builtinHelpOption && isSet(QStringLiteral("help-all")))
        d->showHelp(EXIT_SUCCESS, true);
}